

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O1

bool __thiscall
HVectorBase<HighsCDouble>::isEqual(HVectorBase<HighsCDouble> *this,HVectorBase<HighsCDouble> *v0)

{
  pointer __s1;
  pointer piVar1;
  pointer __s2;
  pointer pHVar2;
  pointer pHVar3;
  int iVar4;
  pointer pHVar5;
  size_t __n;
  double *pdVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  if (this->size != v0->size) {
    return false;
  }
  if (this->count == v0->count) {
    __s1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    piVar1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)piVar1 - (long)__s1;
    __s2 = (v0->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
    if ((__n == (long)(v0->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__s2) &&
       ((piVar1 == __s1 || (iVar4 = bcmp(__s1,__s2,__n), iVar4 == 0)))) {
      pHVar2 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
               .super__Vector_impl_data._M_start;
      pHVar3 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pHVar5 = (v0->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)pHVar3 - (long)pHVar2 ==
          (long)(v0->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pHVar5) {
        bVar7 = pHVar2 == pHVar3;
        if (!bVar7) {
          dVar8 = pHVar2->hi + pHVar2->lo;
          dVar9 = pHVar5->hi + pHVar5->lo;
          if (dVar8 != dVar9) {
            return false;
          }
          if (NAN(dVar8) || NAN(dVar9)) {
            return false;
          }
          pdVar6 = &pHVar5[1].lo;
          while( true ) {
            pHVar5 = pHVar2 + 1;
            bVar7 = pHVar5 == pHVar3;
            if (bVar7) break;
            dVar8 = pHVar5->hi + pHVar2[1].lo;
            dVar9 = ((HighsCDouble *)(pdVar6 + -1))->hi + *pdVar6;
            pdVar6 = pdVar6 + 2;
            if (dVar8 != dVar9) {
              return false;
            }
            pHVar2 = pHVar5;
            if (NAN(dVar8) || NAN(dVar9)) {
              return false;
            }
          }
        }
        if (bVar7) {
          return (bool)(-(v0->synthetic_tick == this->synthetic_tick) & 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool HVectorBase<Real>::isEqual(const HVectorBase<Real>& v0) {
  if (this->size != v0.size) return false;
  if (this->count != v0.count) return false;
  if (this->index != v0.index) return false;
  if (this->array != v0.array) return false;
  //  if (this->index.size() != v0.index.size()) return false;
  //  for (HighsInt el = 0; el < (HighsInt)this->index.size(); el++)
  //    if (this->index[el] != v0.index[el]) return false;
  if (this->synthetic_tick != v0.synthetic_tick) return false;
  return true;
}